

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O0

int it_okt_read_sample_data(IT_SAMPLE *sample,char *data,int length)

{
  void *pvVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  
  if ((in_EDX != 0) && (*(int *)(in_RDI + 0x38) != 0)) {
    if ((in_EDX < *(int *)(in_RDI + 0x38)) &&
       (*(int *)(in_RDI + 0x38) = in_EDX, in_EDX < *(int *)(in_RDI + 0x4c))) {
      *(int *)(in_RDI + 0x4c) = in_EDX;
    }
    pvVar1 = malloc((long)in_EDX);
    *(void **)(in_RDI + 0x58) = pvVar1;
    if (*(long *)(in_RDI + 0x58) == 0) {
      return -1;
    }
    memcpy(*(void **)(in_RDI + 0x58),in_RSI,(long)in_EDX);
  }
  return 0;
}

Assistant:

static int it_okt_read_sample_data(IT_SAMPLE *sample, const char * data, int length)
{
	if (length && sample->length) {
		if (length < sample->length) {
			sample->length = length;
			if (length < sample->sus_loop_end) sample->sus_loop_end = length;
		}

		sample->data = malloc(length);

		if (!sample->data)
			return -1;

		memcpy(sample->data, data, length);
	}

	return 0;
}